

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap *this_00;
  FieldDescriptor *this_01;
  long lVar1;
  FieldGenerator *pFVar2;
  int iVar3;
  ulong uVar4;
  int __c;
  int extraout_EDX;
  int i_00;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX;
  char *pcVar5;
  int i;
  long lVar6;
  ulong uVar7;
  long lVar8;
  string local_50;
  
  io::Printer::Print(printer,"void $classname$::Clear() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x58)) {
    io::Printer::Print(printer,"_extensions_.Clear();\n");
  }
  this_00 = &this->field_generators_;
  uVar4 = 0xffffffffffffffff;
  lVar6 = 0;
  uVar7 = 0;
  do {
    iVar3 = (int)uVar4;
    if ((long)*(int *)(this->descriptor_ + 0x2c) <= (long)uVar7) {
      if (-1 < iVar3) {
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      lVar8 = 0;
      for (lVar6 = 0; lVar6 < *(int *)(this->descriptor_ + 0x2c); lVar6 = lVar6 + 1) {
        lVar1 = *(long *)(this->descriptor_ + 0x30);
        if (*(int *)(lVar1 + 0x30 + lVar8) == 3) {
          pFVar2 = FieldGeneratorMap::get(this_00,(FieldDescriptor *)(lVar1 + lVar8));
          (*pFVar2->_vptr_FieldGenerator[6])(pFVar2,printer);
        }
        lVar8 = lVar8 + 0x78;
      }
      io::Printer::Print(printer,"::memset(_has_bits_, 0, sizeof(_has_bits_));\n");
      if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
        io::Printer::Print(printer,"mutable_unknown_fields()->Clear();\n");
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      return;
    }
    lVar8 = *(long *)(this->descriptor_ + 0x30);
    if (*(int *)(lVar8 + 0x30 + lVar6) != 3) {
      this_01 = (FieldDescriptor *)(lVar8 + lVar6);
      pcVar5 = (char *)0x8;
      uVar4 = (ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
      __c = (int)((long)uVar4 % 8);
      if (iVar3 < 0) {
LAB_001b3d9b:
        if (-1 < iVar3) {
          io::Printer::Outdent(printer);
          pcVar5 = "}\n";
          io::Printer::Print(printer,"}\n");
          __c = extraout_EDX;
        }
        pcVar5 = FieldDescriptor::index(this_01,pcVar5,__c);
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)((ulong)pcVar5 & 0xffffffff),i_00);
        io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
                           "index",&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        io::Printer::Indent(printer);
        field = extraout_RDX;
      }
      else {
        field = (FieldDescriptor *)(uVar7 >> 3 & 0x1fffffff);
        __c = (int)field;
        if (__c != (int)((long)uVar4 / 8)) goto LAB_001b3d9b;
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar8 + 0x2c + lVar6) * 4)
          - 9U < 2) {
        FieldName_abi_cxx11_(&local_50,(cpp *)this_01,field);
        io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        io::Printer::Indent(printer);
        pFVar2 = FieldGeneratorMap::get(this_00,this_01);
        (*pFVar2->_vptr_FieldGenerator[6])(pFVar2,printer);
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      else {
        pFVar2 = FieldGeneratorMap::get(this_00,this_01);
        (*pFVar2->_vptr_FieldGenerator[6])(pFVar2,printer);
      }
      uVar4 = uVar7 & 0xffffffff;
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x78;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print("void $classname$::Clear() {\n",
                 "classname", classname_);
  printer->Indent();

  int last_index = -1;

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // We can use the fact that _has_bits_ is a giant bitfield to our
      // advantage:  We can check up to 32 bits at a time for equality to
      // zero, and skip the whole range if so.  This can improve the speed
      // of Clear() for messages which contain a very large number of
      // optional fields of which only a few are used at a time.  Here,
      // we've chosen to check 8 bits at a time rather than 32.
      if (i / 8 != last_index / 8 || last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }
      last_index = i;

      // It's faster to just overwrite primitive types, but we should
      // only clear strings and messages if they were set.
      // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
      bool should_check_bit =
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

      if (should_check_bit) {
        printer->Print(
          "if (has_$name$()) {\n",
          "name", FieldName(field));
        printer->Indent();
      }

      field_generators_.get(field).GenerateClearingCode(printer);

      if (should_check_bit) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  // Repeated fields don't use _has_bits_ so we clear them in a separate
  // pass.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      field_generators_.get(field).GenerateClearingCode(printer);
    }
  }

  printer->Print(
    "::memset(_has_bits_, 0, sizeof(_has_bits_));\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "mutable_unknown_fields()->Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}